

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCharType.cpp
# Opt level: O0

void __thiscall hdc::UCharType::UCharType(UCharType *this,Token *token)

{
  Token *token_local;
  UCharType *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220308;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_UCHAR_TYPE;
  return;
}

Assistant:

UCharType::UCharType(Token& token) {
    this->token = token;
    this->kind = AST_UCHAR_TYPE;
}